

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

int xml_parse_data(ly_ctx *ctx,lyxml_elem *xml,lyd_node *parent,lyd_node *first_sibling,
                  lyd_node *prev,int options,unres_data *unres,lyd_node **result,
                  lyd_node **act_notif,char *yang_data_name)

{
  LYS_NODE LVar1;
  lyxml_elem *plVar2;
  lyxml_elem *plVar3;
  LY_VLOG_ELEM elem_type;
  int iVar4;
  size_t sVar5;
  undefined8 *puVar6;
  lys_module *plVar7;
  long lVar8;
  lyd_node *plVar9;
  lys_node_list *plVar10;
  char *pcVar11;
  hash_table *phVar12;
  bool bVar13;
  lyd_node **local_170;
  char *local_140;
  lyd_node *local_128;
  char *msg;
  char *str;
  byte local_c5;
  int ret;
  int iStack_c0;
  uint8_t pos;
  int found;
  int filterflag;
  int editbits;
  int r;
  int havechildren;
  int j;
  int i;
  lyxml_elem *next;
  lyxml_elem *child;
  lyxml_attr *attr;
  lyd_attr *dattr_iter;
  lyd_attr *dattr;
  lys_node_augment *aug;
  lys_node *ext_node;
  lys_node *target;
  lys_node *schema;
  lyd_node *dlast;
  lyd_node *diter;
  lys_module *mod;
  lyd_node *plStack_40;
  int options_local;
  lyd_node *prev_local;
  lyd_node *first_sibling_local;
  lyd_node *parent_local;
  lyxml_elem *xml_local;
  ly_ctx *ctx_local;
  
  diter = (lyd_node *)0x0;
  target = (lys_node *)0x0;
  found = 0;
  iStack_c0 = 0;
  mod._4_4_ = options;
  plStack_40 = prev;
  prev_local = first_sibling;
  first_sibling_local = parent;
  parent_local = (lyd_node *)xml;
  xml_local = (lyxml_elem *)ctx;
  if (xml == (lyxml_elem *)0x0) {
    __assert_fail("xml",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                  ,0x7a,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                 );
  }
  if (result == (lyd_node **)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                  ,0x7b,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                 );
  }
  *result = (lyd_node *)0x0;
  if ((xml->flags & 1U) != 0) {
    if ((options & 0x200U) != 0) {
      ly_vlog(ctx,LYE_XML_INVAL,LY_VLOG_XML,xml,"XML element with mixed content");
      return -1;
    }
    return 0;
  }
  if ((xml->ns == (lyxml_ns *)0x0) || (xml->ns->value == (char *)0x0)) {
    if ((options & 0x200U) != 0) {
      ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_XML,xml,"element\'s","namespace");
      return -1;
    }
    return 0;
  }
  if (parent == (lyd_node *)0x0) {
    diter = (lyd_node *)ly_ctx_get_module_by_ns(ctx,xml->ns->value,(char *)0x0,0);
    if (xml_local[1].prev != (lyxml_elem *)0x0) {
      if ((lys_module *)diter == (lys_module *)0x0) {
        diter = (lyd_node *)
                (*(code *)xml_local[1].prev)(xml_local,0,parent_local->ht->recs,0,xml_local[1].name)
        ;
      }
      else if ((*(ushort *)&((lys_module *)diter)->field_0x40 >> 7 & 1) == 0) {
        diter = (lyd_node *)
                (*(code *)xml_local[1].prev)
                          (xml_local,((lys_module *)diter)->name,((lys_module *)diter)->ns,1,
                           xml_local[1].name);
      }
    }
    plVar9 = diter;
    if (((diter != (lyd_node *)0x0) && ((*(ushort *)&diter->child >> 7 & 1) != 0)) &&
       ((*(ushort *)&diter->child >> 6 & 1) == 0)) {
      if ((mod._4_4_ & 0x1000000) == 0) {
        target = xml_data_search_schemanode
                           ((lyxml_elem *)parent_local,(lys_node *)diter[2].next,mod._4_4_);
        if (target == (lys_node *)0x0) {
          for (r = 0; r < (int)(uint)*(byte *)((long)&diter[1].schema + 5); r = r + 1) {
            dattr = (lyd_attr *)((long)diter[1].child + (long)r * 0x68);
            ext_node = (lys_node *)dattr[1].value_str;
            if ((ext_node->nodetype & (LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN) {
              while( true ) {
                bVar13 = false;
                if (ext_node != (lys_node *)0x0) {
                  bVar13 = (ext_node->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
                }
                if (!bVar13) break;
                ext_node = lys_parent(ext_node);
              }
              if (ext_node == (lys_node *)0x0) {
                do {
                  target = lys_getnext(target,(lys_node *)dattr,(lys_module *)0x0,0);
                  if (target == (lys_node *)0x0) break;
                } while (target->name != *(char **)&parent_local->hash);
              }
            }
            if (target != (lys_node *)0x0) break;
          }
        }
      }
      else if (yang_data_name != (char *)0x0) {
        sVar5 = strlen(yang_data_name);
        aug = (lys_node_augment *)
              lyp_get_yang_data_template((lys_module *)plVar9,yang_data_name,(int)sVar5);
        if ((lys_node *)aug != (lys_node *)0x0) {
          puVar6 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (LY_STMT_CONTAINER,(lys_ext_instance_complex *)aug,
                              (lyext_substmt **)0x0);
          target = (lys_node *)*puVar6;
          target = xml_data_search_schemanode((lyxml_elem *)parent_local,target,mod._4_4_);
        }
      }
    }
  }
  else {
    target = xml_data_search_schemanode(xml,parent->schema->child,options);
    if (xml_local[1].prev != (lyxml_elem *)0x0) {
      if ((target == (lys_node *)0x0) ||
         (plVar7 = lys_node_module(target), plVar3 = xml_local,
         (*(ushort *)&plVar7->field_0x40 >> 7 & 1) != 0)) {
        if ((target == (lys_node *)0x0) &&
           (lVar8 = (*(code *)xml_local[1].prev)
                              (xml_local,0,parent_local->ht->recs,0,xml_local[1].name), lVar8 != 0))
        {
          target = xml_data_search_schemanode
                             ((lyxml_elem *)parent_local,first_sibling_local->schema->child,
                              mod._4_4_);
        }
      }
      else {
        plVar2 = xml_local[1].prev;
        plVar7 = lys_node_module(target);
        pcVar11 = plVar7->name;
        plVar7 = lys_node_module(target);
        (*(code *)plVar2)(plVar3,pcVar11,plVar7->ns,1,xml_local[1].name);
      }
    }
  }
  diter = (lyd_node *)lys_node_module(target);
  if ((((lys_module *)diter == (lys_module *)0x0) ||
      ((*(ushort *)&((lys_module *)diter)->field_0x40 >> 7 & 1) == 0)) ||
     ((*(ushort *)&((lys_module *)diter)->field_0x40 >> 6 & 1) != 0)) {
    if ((mod._4_4_ & 0x200) != 0) {
      elem_type = LY_VLOG_STR;
      if (first_sibling_local == (lyd_node *)0x0) {
        local_128 = (lyd_node *)0x1ec7a0;
      }
      else {
        elem_type = LY_VLOG_LYD;
        local_128 = first_sibling_local;
      }
      ly_vlog((ly_ctx *)xml_local,LYE_INELEM,elem_type,local_128,*(undefined8 *)&parent_local->hash)
      ;
      return -1;
    }
    return 0;
  }
  LVar1 = target->nodetype;
  if (LVar1 == LYS_CONTAINER) {
LAB_0015ce8b:
    havechildren = 0;
    while( true ) {
      bVar13 = false;
      if (parent_local->child != (lyd_node *)0x0) {
        bVar13 = *(char *)((long)&parent_local->child->schema + (long)havechildren) != '\0';
      }
      if (!bVar13) break;
      if (((*(char *)((long)&parent_local->child->schema + (long)havechildren) != ' ') &&
          (*(char *)((long)&parent_local->child->schema + (long)havechildren) != '\t')) &&
         ((*(char *)((long)&parent_local->child->schema + (long)havechildren) != '\n' &&
          (*(char *)((long)&parent_local->child->schema + (long)havechildren) != '\r')))) {
        sVar5 = strlen((char *)parent_local->child);
        pcVar11 = (char *)malloc(sVar5 + 0x17);
        if (pcVar11 == (char *)0x0) {
          ly_log((ly_ctx *)xml_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "xml_parse_data");
          return -1;
        }
        sprintf(pcVar11,"node with text data \"%s\"",parent_local->child);
        ly_vlog((ly_ctx *)xml_local,LYE_XML_INVAL,LY_VLOG_XML,parent_local,pcVar11);
        free(pcVar11);
        return -1;
      }
      havechildren = havechildren + 1;
    }
    plVar9 = (lyd_node *)calloc(1,0x48);
    *result = plVar9;
    editbits = 1;
  }
  else if ((LVar1 == LYS_LEAF) || (LVar1 == LYS_LEAFLIST)) {
    plVar9 = (lyd_node *)calloc(1,0x50);
    *result = plVar9;
    editbits = 0;
  }
  else {
    if (LVar1 == LYS_LIST) goto LAB_0015ce8b;
    if (LVar1 != LYS_ANYXML) {
      if (((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_ACTION)) goto LAB_0015ce8b;
      if (LVar1 != LYS_ANYDATA) {
        ly_log((ly_ctx *)xml_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
               ,0xfe);
        return -1;
      }
    }
    plVar9 = (lyd_node *)calloc(1,0x40);
    *result = plVar9;
    editbits = 0;
  }
  if (*result == (lyd_node *)0x0) {
    ly_log((ly_ctx *)xml_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xml_parse_data")
    ;
    return -1;
  }
  (*result)->prev = *result;
  (*result)->schema = target;
  (*result)->parent = first_sibling_local;
  dlast = (lyd_node *)0x0;
  if ((target->nodetype == LYS_LEAF) &&
     (plVar10 = lys_is_key((lys_node_leaf *)target,&local_c5), plVar10 != (lys_node_list *)0x0)) {
    if (first_sibling_local == (lyd_node *)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                    ,0x109,
                    "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                   );
    }
    havechildren = 0;
    dlast = first_sibling_local->child;
    while( true ) {
      bVar13 = false;
      if (((dlast != (lyd_node *)0x0) && (bVar13 = false, havechildren < (int)(uint)local_c5)) &&
         (bVar13 = false, dlast->schema->nodetype == LYS_LEAF)) {
        plVar10 = lys_is_key((lys_node_leaf *)dlast->schema,(uint8_t *)0x0);
        bVar13 = plVar10 != (lys_node_list *)0x0;
      }
      if (!bVar13) break;
      havechildren = havechildren + 1;
      dlast = dlast->next;
    }
    if (dlast != (lyd_node *)0x0) {
      if ((mod._4_4_ & 0x200) != 0) {
        ly_vlog((ly_ctx *)xml_local,LYE_INORDER,LY_VLOG_LYD,*result,target->name,dlast->schema->name
               );
        ly_vlog((ly_ctx *)xml_local,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "Invalid position of the key \"%s\" in a list \"%s\".",target->name,
                first_sibling_local->schema->name);
        free(*result);
        *result = (lyd_node *)0x0;
        return -1;
      }
      ly_log((ly_ctx *)xml_local,LY_LLWRN,LY_SUCCESS,
             "Invalid position of the key \"%s\" in a list \"%s\".",target->name,
             first_sibling_local->schema->name);
      if (first_sibling_local->child == dlast) {
        first_sibling_local->child = *result;
        prev_local = *result;
      }
      if (dlast->prev->next != (lyd_node *)0x0) {
        dlast->prev->next = *result;
      }
      (*result)->prev = dlast->prev;
      dlast->prev = *result;
      (*result)->next = dlast;
    }
  }
  if (dlast == (lyd_node *)0x0) {
    if ((first_sibling_local != (lyd_node *)0x0) && (first_sibling_local->child == (lyd_node *)0x0))
    {
      first_sibling_local->child = *result;
    }
    if (plStack_40 == (lyd_node *)0x0) {
      (*result)->prev = *result;
      prev_local = *result;
    }
    else {
      (*result)->prev = plStack_40;
      plStack_40->next = *result;
      prev_local->prev = *result;
    }
  }
  iVar4 = ly_new_node_validity((*result)->schema);
  (*result)->validity = (uint8_t)iVar4;
  iVar4 = resolve_applies_when(target,0,(lys_node *)0x0);
  if (iVar4 != 0) {
    (*result)->field_0x9 = (*result)->field_0x9 & 0xf1 | 8;
  }
  for (child = (lyxml_elem *)parent_local->attr; child != (lyxml_elem *)0x0; child = child->parent)
  {
    if (*(int *)child == 1) {
      if (child->attr == (lyxml_attr *)0x0) {
        if ((((*result)->schema->nodetype == LYS_ANYXML) &&
            (iVar4 = ly_strequal_((*result)->schema->name,"filter"), iVar4 != 0)) &&
           ((iVar4 = ly_strequal_((*result)->schema->module->name,"ietf-netconf"), iVar4 != 0 ||
            (iVar4 = ly_strequal_((*result)->schema->module->name,"notifications"), iVar4 != 0)))) {
          msg = "urn:ietf:params:xml:ns:netconf:base:1.0";
          iStack_c0 = 1;
          goto LAB_0015d4f7;
        }
      }
      else {
        msg = child->attr->value;
LAB_0015d4f7:
        filterflag = lyp_fill_attr((ly_ctx *)xml_local,*result,msg,(char *)0x0,&child->child->flags,
                                   &child->next->flags,(lyxml_elem *)parent_local,mod._4_4_,
                                   &dattr_iter);
        if (filterflag == -1) goto LAB_0015dfad;
        if (filterflag != 1) {
          if ((iStack_c0 != 0) && (iVar4 = strcmp(&child->child->flags,"select"), iVar4 == 0)) {
            pcVar11 = transform_xml2json((ly_ctx *)xml_local,dattr_iter->value_str,
                                         (lyxml_elem *)parent_local,0,0);
            (dattr_iter->value).binary = pcVar11;
            if ((dattr_iter->value).binary == (char *)0x0) {
              dattr_iter->value = (lyd_val)dattr_iter->value_str;
              goto LAB_0015dfad;
            }
            lydict_remove((ly_ctx *)xml_local,dattr_iter->value_str);
            dattr_iter->value_str = (char *)dattr_iter->value;
          }
          if ((*result)->attr == (lyd_attr *)0x0) {
            (*result)->attr = dattr_iter;
          }
          else {
            for (attr = (lyxml_attr *)(*result)->attr; attr->next != (lyxml_attr *)0x0;
                attr = attr->next) {
            }
            attr->next = (lyxml_attr *)dattr_iter;
          }
          goto LAB_0015d71b;
        }
      }
      if ((mod._4_4_ & 0x200) != 0) {
        ly_vlog((ly_ctx *)xml_local,LYE_INATTR,LY_VLOG_LYD,*result,child->child);
        goto LAB_0015dfad;
      }
      if (child->attr == (lyxml_attr *)0x0) {
        local_140 = "<none>";
      }
      else {
        local_140 = child->attr->name;
      }
      ly_log((ly_ctx *)xml_local,LY_LLWRN,LY_SUCCESS,
             "Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",local_140,child->child,
             child->next);
    }
LAB_0015d71b:
  }
  if ((mod._4_4_ & 8) == 0) {
    if (iStack_c0 == 0) goto LAB_0015daee;
    ret = 0;
    for (attr = (lyxml_attr *)(*result)->attr; attr != (lyxml_attr *)0x0; attr = attr->next) {
      iVar4 = strcmp(attr->name,"type");
      if (iVar4 == 0) {
        if (((ret == 1) || (ret == 2)) || (ret == 4)) {
          ly_vlog((ly_ctx *)xml_local,LYE_TOOMANY,LY_VLOG_LYD,*result,"type",
                  *(undefined8 *)&parent_local->hash);
          goto LAB_0015dfad;
        }
        if (*(int *)(*(long *)(attr + 1) + 0x1c) == 0) {
          if (ret == 3) {
            ly_vlog((ly_ctx *)xml_local,LYE_INATTR,LY_VLOG_LYD,*result,attr->name);
            goto LAB_0015dfad;
          }
          if (ret != 0) {
            __assert_fail("!found",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                          ,0x18d,
                          "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                         );
          }
          ret = 1;
        }
        else {
          if (*(int *)(*(long *)(attr + 1) + 0x1c) != 1) {
            ly_log((ly_ctx *)xml_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                   ,0x19a);
            goto LAB_0015dfad;
          }
          if (ret == 3) {
            ret = 4;
          }
          else {
            if (ret != 0) {
              __assert_fail("!found",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                            ,0x195,
                            "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                           );
            }
            ret = 2;
          }
        }
      }
      else {
        iVar4 = strcmp(attr->name,"select");
        if (iVar4 == 0) {
          switch(ret) {
          case 0:
            ret = 3;
            break;
          case 1:
            ly_vlog((ly_ctx *)xml_local,LYE_INATTR,LY_VLOG_LYD,*result,attr->name);
            goto LAB_0015dfad;
          case 2:
            ret = 4;
            break;
          case 3:
          case 4:
            ly_vlog((ly_ctx *)xml_local,LYE_TOOMANY,LY_VLOG_LYD,*result,"select",
                    *(undefined8 *)&parent_local->hash);
            goto LAB_0015dfad;
          default:
            ly_log((ly_ctx *)xml_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                   ,0x1ad);
            goto LAB_0015dfad;
          }
        }
      }
    }
    switch(ret) {
    case 1:
    case 4:
      goto LAB_0015daee;
    case 2:
      ly_vlog((ly_ctx *)xml_local,LYE_MISSATTR,LY_VLOG_LYD,*result,"select",
              *(undefined8 *)&parent_local->hash);
      break;
    case 3:
      ly_vlog((ly_ctx *)xml_local,LYE_MISSATTR,LY_VLOG_LYD,*result,"type",
              *(undefined8 *)&parent_local->hash);
      break;
    default:
      ly_log((ly_ctx *)xml_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
             ,0x1c0);
    }
LAB_0015dfad:
    lyd_unlink_internal(*result,2);
  }
  else {
    iVar4 = lyp_check_edit_attr((ly_ctx *)xml_local,(*result)->attr,*result,&found);
    if (iVar4 != 0) goto LAB_0015dfad;
LAB_0015daee:
    if ((target->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      if ((target->nodetype & LYS_ANYDATA) == LYS_UNKNOWN) {
        if ((target->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
          if (target->nodetype == LYS_NOTIF) {
            if (((mod._4_4_ & 0x40) == 0) || (*act_notif != (lyd_node *)0x0)) {
              ly_vlog((ly_ctx *)xml_local,LYE_INELEM,LY_VLOG_LYD,*result,target->name);
              ly_vlog((ly_ctx *)xml_local,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                      "Unexpected notification node \"%s\".",target->name);
              goto LAB_0015dfad;
            }
            *act_notif = *result;
          }
        }
        else {
          if (((mod._4_4_ & 0x10) == 0) || (*act_notif != (lyd_node *)0x0)) {
            ly_vlog((ly_ctx *)xml_local,LYE_INELEM,LY_VLOG_LYD,*result,target->name);
            pcVar11 = "action";
            if (target->nodetype == LYS_RPC) {
              pcVar11 = "rpc";
            }
            ly_vlog((ly_ctx *)xml_local,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                    "Unexpected %s node \"%s\".",pcVar11,target->name);
            goto LAB_0015dfad;
          }
          *act_notif = *result;
        }
      }
      else if (parent_local->next == (lyd_node *)0x0) {
        *(undefined4 *)&(*result)->field_0x34 = 0;
        phVar12 = (hash_table *)lydict_insert((ly_ctx *)xml_local,(char *)parent_local->child,0);
        (*result)->ht = phVar12;
      }
      else {
        _j = (lyxml_elem *)parent_local->next;
        parent_local->next = (lyd_node *)0x0;
        next = _j;
        for (; _j != (lyxml_elem *)0x0; _j = _j->next) {
          _j->parent = (lyxml_elem *)0x0;
          lyxml_correct_elem_ns((ly_ctx *)xml_local,_j,1,1);
        }
        *(undefined4 *)&(*result)->field_0x34 = 8;
        (*result)->ht = (hash_table *)next;
      }
    }
    else {
      iVar4 = xml_get_value(*result,(lyxml_elem *)parent_local,found,mod._4_4_ & 0x2000);
      if (iVar4 != 0) goto LAB_0015dfad;
    }
    if (((*result)->schema->nodetype != LYS_LIST) || ((*result)->schema->padding[2] == '\0')) {
      lyd_hash(*result);
      lyd_insert_hash(*result);
    }
    iVar4 = lyv_data_context(*result,mod._4_4_,unres);
    if (iVar4 == 0) {
      if ((editbits != 0) && (parent_local->next != (lyd_node *)0x0)) {
        schema = (lys_node *)0x0;
        dlast = (lyd_node *)0x0;
        next = (lyxml_elem *)parent_local->next;
        while (next != (lyxml_elem *)0x0) {
          _j = next->next;
          filterflag = xml_parse_data((ly_ctx *)xml_local,next,*result,(*result)->child,
                                      (lyd_node *)schema,mod._4_4_,unres,&dlast,act_notif,
                                      yang_data_name);
          if (filterflag != 0) goto LAB_0015dfbe;
          if ((mod._4_4_ & 0x400) != 0) {
            lyxml_free((ly_ctx *)xml_local,next);
          }
          if ((dlast != (lyd_node *)0x0) && (dlast->next == (lyd_node *)0x0)) {
            schema = (lys_node *)dlast;
          }
          next = _j;
        }
      }
      if ((((target->nodetype == LYS_CONTAINER) && ((*result)->child == (lyd_node *)0x0)) &&
          ((*result)->attr == (lyd_attr *)0x0)) &&
         (lVar8._0_2_ = target[1].flags, lVar8._2_1_ = target[1].ext_size,
         lVar8._3_1_ = target[1].iffeature_size, lVar8._4_1_ = target[1].padding[0],
         lVar8._5_1_ = target[1].padding[1], lVar8._6_1_ = target[1].padding[2],
         lVar8._7_1_ = target[1].padding[3], lVar8 == 0)) {
        (*result)->field_0x9 = (*result)->field_0x9 & 0xfe | 1;
      }
      iVar4 = lyv_data_content(*result,mod._4_4_,unres);
      if (iVar4 == 0) {
        if (plStack_40 == (lyd_node *)0x0) {
          local_170 = (lyd_node **)0x0;
        }
        else {
          local_170 = &prev_local;
        }
        iVar4 = lyv_multicases(*result,(lys_node *)0x0,local_170,0,(lyd_node *)0x0);
        if (iVar4 == 0) {
          if (((*result)->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
            (*result)->validity = (*result)->validity | 1;
          }
          return 0;
        }
      }
    }
  }
LAB_0015dfbe:
  havechildren = unres->count;
  while (havechildren = havechildren - 1, -1 < havechildren) {
    if (unres->node[havechildren] == *result) {
      unres_data_del(unres,havechildren);
    }
  }
  lyd_free(*result);
  *result = (lyd_node *)0x0;
  return -1;
}

Assistant:

static int
xml_parse_data(struct ly_ctx *ctx, struct lyxml_elem *xml, struct lyd_node *parent, struct lyd_node *first_sibling,
               struct lyd_node *prev, int options, struct unres_data *unres, struct lyd_node **result,
               struct lyd_node **act_notif, const char *yang_data_name)
{
    const struct lys_module *mod = NULL;
    struct lyd_node *diter, *dlast;
    struct lys_node *schema = NULL, *target;
    const struct lys_node *ext_node;
    struct lys_node_augment *aug;
    struct lyd_attr *dattr, *dattr_iter;
    struct lyxml_attr *attr;
    struct lyxml_elem *child, *next;
    int i, j, havechildren, r, editbits = 0, filterflag = 0, found;
    uint8_t pos;
    int ret = 0;
    const char *str = NULL;
    char *msg;

    assert(xml);
    assert(result);
    *result = NULL;

    if (xml->flags & LYXML_ELEM_MIXED) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, "XML element with mixed content");
            return -1;
        } else {
            return 0;
        }
    }

    if (!xml->ns || !xml->ns->value) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_XML, xml, "element's", "namespace");
            return -1;
        } else {
            return 0;
        }
    }

    /* find schema node */
    if (!parent) {
        mod = ly_ctx_get_module_by_ns(ctx, xml->ns->value, NULL, 0);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }

        /* get the proper schema node */
        if (mod && mod->implemented && !mod->disabled) {
            if (options & LYD_OPT_DATA_TEMPLATE) {
                if (yang_data_name) {
                    ext_node = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
                    if (ext_node) {
                        schema = *((struct lys_node **) lys_ext_complex_get_substmt(LY_STMT_CONTAINER, (struct lys_ext_instance_complex *)ext_node, NULL));
                        schema = xml_data_search_schemanode(xml, schema, options);
                    }
                }
            } else {
                schema = xml_data_search_schemanode(xml, mod->data, options);
                if (!schema) {
                    /* it still can be the specific case of this module containing an augment of another module
                    * top-level choice or top-level choice's case, bleh */
                    for (j = 0; j < mod->augment_size; ++j) {
                        aug = &mod->augment[j];
                        target = aug->target;
                        if (target->nodetype & (LYS_CHOICE | LYS_CASE)) {
                            /* 1) okay, the target is choice or case */
                            while (target && (target->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                                target = lys_parent(target);
                            }
                            /* 2) now, the data node will be top-level, there are only non-data schema nodes */
                            if (!target) {
                                while ((schema = (struct lys_node *) lys_getnext(schema, (struct lys_node *) aug, NULL, 0))) {
                                    /* 3) alright, even the name matches, we found our schema node */
                                    if (ly_strequal(schema->name, xml->name, 1)) {
                                        break;
                                    }
                                }
                            }
                        }

                        if (schema) {
                            break;
                        }
                    }
                }
            }
        }
    } else {
        /* parsing some internal node, we start with parent's schema pointer */
        schema = xml_data_search_schemanode(xml, parent->schema->child, options);

        if (ctx->data_clb) {
            if (schema && !lys_node_module(schema)->implemented) {
                ctx->data_clb(ctx, lys_node_module(schema)->name, lys_node_module(schema)->ns,
                              LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            } else if (!schema) {
                if (ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data)) {
                    /* context was updated, so try to find the schema node again */
                    schema = xml_data_search_schemanode(xml, parent->schema->child, options);
                }
            }
        }
    }

    mod = lys_node_module(schema);
    if (!mod || !mod->implemented || mod->disabled) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_INELEM, (parent ? LY_VLOG_LYD : LY_VLOG_STR), (parent ? (void *)parent : (void *)"/") , xml->name);
            return -1;
        } else {
            return 0;
        }
    }

    /* create the element structure */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        for (i = 0; xml->content && xml->content[i]; ++i) {
            if (!is_xmlws(xml->content[i])) {
                msg = malloc(22 + strlen(xml->content) + 1);
                LY_CHECK_ERR_RETURN(!msg, LOGMEM(ctx), -1);
                sprintf(msg, "node with text data \"%s\"", xml->content);
                LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, msg);
                free(msg);
                return -1;
            }
        }
        *result = calloc(1, sizeof **result);
        havechildren = 1;
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        *result = calloc(1, sizeof(struct lyd_node_leaf_list));
        havechildren = 0;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        *result = calloc(1, sizeof(struct lyd_node_anydata));
        havechildren = 0;
        break;
    default:
        LOGINT(ctx);
        return -1;
    }
    LY_CHECK_ERR_RETURN(!(*result), LOGMEM(ctx), -1);

    (*result)->prev = *result;
    (*result)->schema = schema;
    (*result)->parent = parent;
    diter = NULL;
    if (schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)schema, &pos)) {
        /* it is key and we need to insert it into a correct place (a key must have a parent list) */
        assert(parent);
        for (i = 0, diter = parent->child;
                diter && i < pos && diter->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)diter->schema, NULL);
                i++, diter = diter->next);
        if (diter) {
            /* out of order insertion - insert list's key to the correct position, before the diter */
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INORDER, LY_VLOG_LYD, *result, schema->name, diter->schema->name);
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid position of the key \"%s\" in a list \"%s\".",
                       schema->name, parent->schema->name);
                free(*result);
                *result = NULL;
                return -1;
            } else {
                LOGWRN(ctx, "Invalid position of the key \"%s\" in a list \"%s\".", schema->name, parent->schema->name)
            }
            if (parent->child == diter) {
                parent->child = *result;
                /* update first_sibling */
                first_sibling = *result;
            }
            if (diter->prev->next) {
                diter->prev->next = *result;
            }
            (*result)->prev = diter->prev;
            diter->prev = *result;
            (*result)->next = diter;
        }
    }
    if (!diter) {
        /* simplified (faster) insert as the last node */
        if (parent && !parent->child) {
            parent->child = *result;
        }
        if (prev) {
            (*result)->prev = prev;
            prev->next = *result;

            /* fix the "last" pointer */
            first_sibling->prev = *result;
        } else {
            (*result)->prev = *result;
            first_sibling = *result;
        }
    }
    (*result)->validity = ly_new_node_validity((*result)->schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        (*result)->when_status = LYD_WHEN;
    }

    /* process attributes */
    for (attr = xml->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_STD) {
            continue;
        } else if (!attr->ns) {
            if ((*result)->schema->nodetype == LYS_ANYXML &&
                    ly_strequal((*result)->schema->name, "filter", 0) &&
                    (ly_strequal((*result)->schema->module->name, "ietf-netconf", 0) ||
                    ly_strequal((*result)->schema->module->name, "notifications", 0))) {
                /* NETCONF filter's attributes, which we implement as non-standard annotations,
                 * they are unqualified (no namespace), but we know that we have internally defined
                 * them in the ietf-netconf module */
                str = "urn:ietf:params:xml:ns:netconf:base:1.0";
                filterflag = 1;
            } else {
                /* garbage */
                goto attr_error;
            }
        } else {
            str = attr->ns->value;
        }

        r = lyp_fill_attr(ctx, *result, str, NULL, attr->name, attr->value, xml, options, &dattr);
        if (r == -1) {
            goto unlink_node_error;
        } else if (r == 1) {
attr_error:
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, *result, attr->name);
                goto unlink_node_error;
            }

            LOGWRN(ctx, "Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",
                   (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
            continue;
        }

        /* special case of xpath in the value, we want to convert it to JSON */
        if (filterflag && !strcmp(attr->name, "select")) {
            dattr->value.string = transform_xml2json(ctx, dattr->value_str, xml, 0, 0);
            if (!dattr->value.string) {
                /* problem with resolving value as xpath */
                dattr->value.string = dattr->value_str;
                goto unlink_node_error;
            }
            lydict_remove(ctx, dattr->value_str);
            dattr->value_str = dattr->value.string;
        }

        /* insert into the data node */
        if (!(*result)->attr) {
            (*result)->attr = dattr;
        } else {
            for (dattr_iter = (*result)->attr; dattr_iter->next; dattr_iter = dattr_iter->next);
            dattr_iter->next = dattr;
        }
        continue;
    }

    /* check insert attribute and its values */
    if (options & LYD_OPT_EDIT) {
        if (lyp_check_edit_attr(ctx, (*result)->attr, *result, &editbits)) {
            goto unlink_node_error;
        }

    /* check correct filter extension attributes */
    } else if (filterflag) {
        found = 0; /* 0 - nothing, 1 - type subtree, 2 - type xpath, 3 - select, 4 - type xpath + select */
        LY_TREE_FOR((*result)->attr, dattr_iter) {
            if (!strcmp(dattr_iter->name, "type")) {
                if ((found == 1) || (found == 2) || (found == 4)) {
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "type", xml->name);
                    goto unlink_node_error;
                }
                switch (dattr_iter->value.enm->value) {
                case 0:
                    /* subtree */
                    if (found == 3) {
                        LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                        goto unlink_node_error;
                    }

                    assert(!found);
                    found = 1;
                    break;
                case 1:
                    /* xpath */
                    if (found == 3) {
                        found = 4;
                    } else {
                        assert(!found);
                        found = 2;
                    }
                    break;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            } else if (!strcmp(dattr_iter->name, "select")) {
                switch (found) {
                case 0:
                    found = 3;
                    break;
                case 1:
                    LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                    goto unlink_node_error;
                case 2:
                    found = 4;
                    break;
                case 3:
                case 4:
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "select", xml->name);
                    goto unlink_node_error;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            }
        }

        /* check if what we found is correct */
        switch (found) {
        case 1:
        case 4:
            /* ok */
            break;
        case 2:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "select", xml->name);
            goto unlink_node_error;
        case 3:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "type", xml->name);
            goto unlink_node_error;
        default:
            LOGINT(ctx);
            goto unlink_node_error;
        }
    }

    /* type specific processing */
    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* type detection and assigning the value */
        if (xml_get_value(*result, xml, editbits, options & LYD_OPT_TRUSTED)) {
            goto unlink_node_error;
        }
    } else if (schema->nodetype & LYS_ANYDATA) {
        /* store children values */
        if (xml->child) {
            child = xml->child;
            /* manually unlink all siblings and correct namespaces */
            xml->child = NULL;
            LY_TREE_FOR(child, next) {
                next->parent = NULL;
                lyxml_correct_elem_ns(ctx, next, 1, 1);
            }

            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_XML;
            ((struct lyd_node_anydata *)*result)->value.xml = child;
        } else {
            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_CONSTSTRING;
            ((struct lyd_node_anydata *)*result)->value.str = lydict_insert(ctx, xml->content, 0);
        }
    } else if (schema->nodetype & (LYS_RPC | LYS_ACTION)) {
        if (!(options & LYD_OPT_RPC) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                   (schema->nodetype == LYS_RPC ? "rpc" : "action"), schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    } else if (schema->nodetype == LYS_NOTIF) {
        if (!(options & LYD_OPT_NOTIF) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected notification node \"%s\".", schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if (((*result)->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)(*result)->schema)->keys_size) {
        lyd_hash(*result);
        lyd_insert_hash(*result);
    }
#endif

    /* first part of validation checks */
    if (lyv_data_context(*result, options, unres)) {
        goto error;
    }

    /* process children */
    if (havechildren && xml->child) {
        diter = dlast = NULL;
        LY_TREE_FOR_SAFE(xml->child, next, child) {
            r = xml_parse_data(ctx, child, *result, (*result)->child, dlast, options, unres, &diter, act_notif, yang_data_name);
            if (r) {
                goto error;
            } else if (options & LYD_OPT_DESTRUCT) {
                lyxml_free(ctx, child);
            }
            if (diter && !diter->next) {
                /* the child was parsed/created and it was placed as the last child. The child can be inserted
                 * out of order (not as the last one) in case it is a list's key present out of the correct order */
                dlast = diter;
            }
        }
    }

    /* if we have empty non-presence container, we keep it, but mark it as default */
    if (schema->nodetype == LYS_CONTAINER && !(*result)->child &&
            !(*result)->attr && !((struct lys_node_container *)schema)->presence) {
        (*result)->dflt = 1;
    }

    /* rest of validation checks */
    if (lyv_data_content(*result, options, unres) ||
            lyv_multicases(*result, NULL, prev ? &first_sibling : NULL, 0, NULL)) {
        goto error;
    }

    /* validation successful */
    if ((*result)->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* postpone checking when there will be all list/leaflist instances */
        (*result)->validity |= LYD_VAL_DUP;
    }

    return ret;

unlink_node_error:
    lyd_unlink_internal(*result, 2);
error:
    /* cleanup */
    for (i = unres->count - 1; i >= 0; i--) {
        /* remove unres items connected with the node being removed */
        if (unres->node[i] == *result) {
            unres_data_del(unres, i);
        }
    }
    lyd_free(*result);
    *result = NULL;
    return -1;
}